

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O1

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestCustomValueOptions_Test::
TestBody(DescriptorPoolTypeResolverTest_TestCustomValueOptions_Test *this)

{
  TypeResolver *pTVar1;
  bool bVar2;
  EnumValue *pEVar3;
  Enum *pEVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  AlphaNum *in_R8;
  char *in_R9;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  string_view name;
  string_view name_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar__1;
  Enum type;
  internal local_140 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  string local_130;
  string local_110;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  AlphaNum local_b0;
  StatusRep *local_80;
  Enum local_78;
  
  Enum::Enum(&local_78,(Arena *)0x0);
  pTVar1 = (this->super_DescriptorPoolTypeResolverTest).resolver_._M_t.
           super___uniq_ptr_impl<google::protobuf::util::TypeResolver,_std::default_delete<google::protobuf::util::TypeResolver>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::TypeResolver_*,_std::default_delete<google::protobuf::util::TypeResolver>_>
           .super__Head_base<0UL,_google::protobuf::util::TypeResolver_*,_false>._M_head_impl;
  local_110._M_dataplus._M_p = &DAT_00000013;
  local_110._M_string_length = 0x1285da0;
  local_e0 = (undefined1  [8])0x1;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13ab429;
  local_b0.piece_._M_len = 0x33;
  local_b0.piece_._M_str = "proto2_unittest.TestMessageWithCustomOptions.AnEnum";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_130,(lts_20250127 *)&local_110,(AlphaNum *)local_e0,&local_b0,in_R8);
  pEVar4 = &local_78;
  (*pTVar1->_vptr_TypeResolver[3])(&local_80,pTVar1,&local_130);
  local_140[0] = (internal)(local_80 == (StatusRep *)0x1);
  local_138 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (((ulong)local_80 & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_138;
  if (local_140[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,local_140,
               (AssertionResult *)
               "resolver_ ->ResolveEnumType( GetTypeUrl(\"proto2_unittest.TestMessageWithCustomOptions.AnEnum\"), &type) .ok()"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,0x18d,local_110._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    __ptr_00 = local_138;
    if (local_e0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_e0 + 8))();
      __ptr_00 = local_138;
    }
    goto LAB_00bd934b;
  }
  if (local_138 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,local_138);
  }
  name_00._M_str = (char *)pEVar4;
  name_00._M_len = (size_t)"ANENUM_VAL2";
  pEVar3 = FindEnumValue((anon_unknown_0 *)&local_78,(Enum *)&DAT_0000000b,name_00);
  local_e0[0] = pEVar3 != (EnumValue *)0x0;
  local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pEVar3 == (EnumValue *)0x0) {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_110,(internal *)local_e0,(AssertionResult *)0x119c39c,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
               ,399,local_110._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_b0);
LAB_00bd930e:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b0.piece_._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_b0.piece_._M_len + 8))();
    }
  }
  else {
    name._M_str = "proto2_unittest.enum_value_opt1";
    name._M_len = 0x1f;
    bVar2 = HasInt32Option(&(pEVar3->field_0)._impl_.options_,name,0x7b);
    local_e0[0] = bVar2;
    local_d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_110,(internal *)local_e0,
                 (AssertionResult *)
                 "HasInt32Option(value->options(), \"proto2_unittest.enum_value_opt1\", 123)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/type_resolver_util_test.cc"
                 ,0x191,local_110._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_b0);
      goto LAB_00bd930e;
    }
  }
  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_d8;
  __ptr_00 = local_d8;
LAB_00bd934b:
  if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()(this_00,__ptr_00);
  }
  Enum::~Enum(&local_78);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestCustomValueOptions) {
  Enum type;
  ASSERT_TRUE(
      resolver_
          ->ResolveEnumType(
              GetTypeUrl("proto2_unittest.TestMessageWithCustomOptions.AnEnum"),
              &type)
          .ok());
  const EnumValue* value = FindEnumValue(type, "ANENUM_VAL2");
  ASSERT_TRUE(value != nullptr);
  ASSERT_TRUE(
      HasInt32Option(value->options(), "proto2_unittest.enum_value_opt1", 123));
}